

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleGeometryNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiNode *this_00;
  aiNode *newNode;
  aiScene *pScene_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pushNode(this,this_00,pScene);
  this->m_tokenType = 5;
  this->m_currentNode = this_00;
  handleNodes(this,node,pScene);
  popNode(this);
  return;
}

Assistant:

void OpenGEXImporter::handleGeometryNode( DDLNode *node, aiScene *pScene ) {
    aiNode *newNode = new aiNode;
    pushNode( newNode, pScene );
    m_tokenType = Grammar::GeometryNodeToken;
    m_currentNode = newNode;
    handleNodes( node, pScene );

    popNode();
}